

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O3

vtt_t * vtt_parse(utf8_char_t *data,size_t size)

{
  vtt_t *pvVar1;
  
  pvVar1 = _vtt_parse(data,size,0);
  return pvVar1;
}

Assistant:

vtt_t* _vtt_parse(const utf8_char_t* data, size_t size, int srt_mode)
{
    vtt_t* vtt = NULL;
    double str_pts = 0, end_pts = 0;
    size_t line_length = 0, trimmed_length = 0;
    char* cue_settings;
    enum VTT_BLOCK_TYPE block_type;
    size_t cue_id_length = 0;
    const utf8_char_t* cue_id = NULL;

    if (!data || !size || size < 6) {
        return NULL;
    }

    // TODO: Support UTF-8 BOM?
    if (!srt_mode && strncmp(data, "WEBVTT", 6) != 0) {
        // WebVTT files must start with WEBVTT
        fprintf(stderr, "Invalid webvtt header: %.*s\n", 6, data);
        return NULL;
    }

    data += 6;
    size -= 6;

    vtt = vtt_new();

    for (;;) {
        line_length = 0;

        do {
            data += line_length;
            size -= line_length;
            line_length = utf8_line_length(data); // Line length
            trimmed_length = utf8_trimmed_length(data, line_length);
            // Skip empty lines
        } while (0 < line_length && 0 == trimmed_length);

        // line length only zero at EOF
        if (0 == line_length) {
            break;
        }

        if (strnstr(data, "REGION", line_length) != NULL) {
            block_type = VTT_REGION;
        } else if (strnstr(data, "STYLE", line_length) != NULL) {
            block_type = VTT_STYLE;
        } else if (strnstr(data, "NOTE", line_length) != NULL) {
            block_type = VTT_NOTE;
        } else if (strnstr(data, "-->", line_length) != NULL) {
            block_type = VTT_CUE;
            parse_timestamps(data, &str_pts, &end_pts, &cue_settings);
            if (str_pts == -1) {
                // Failed to parse timestamps
                fprintf(stderr, "Bad timestamp: %.*s\n", (int)line_length, data);
                return NULL;
            }
        } else {
            if (cue_id != NULL) {
                // Invalid text found
                fprintf(stderr, "ERR: Unrecognized block\n");
                return NULL;
            }

            cue_id = data;
            cue_id_length = line_length;

            data += line_length;
            size -= line_length;
            continue;
        }

        data += line_length;
        size -= line_length;

        // Caption text starts here
        const utf8_char_t* text = data;
        size_t text_size = 0;

        line_length = 0;

        do {
            text_size += line_length;
            line_length = utf8_line_length(data);
            trimmed_length = utf8_trimmed_length(data, line_length);
            // printf ("cap (%d): '%.*s'\n", line_length, (int) trimmed_length, data);
            data += line_length;
            size -= line_length;
        } while (trimmed_length);

        // should we trim here?

        vtt_block_t* block = vtt_block_new(vtt, text, text_size, block_type);

        if (block_type == VTT_CUE) {
            block->timestamp = str_pts;
            block->duration = end_pts - str_pts;
            block->cue_settings = cue_settings;
            if (cue_id != NULL) {
                block->cue_id = malloc(cue_id_length + 1);
                memcpy(block->cue_id, cue_id, cue_id_length);
                block->cue_id[cue_id_length] = '\0';
            }
        }

        cue_id = NULL;
    }

    return vtt;
}